

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string *__ptr;
  string sStack_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  glyph g;
  
  __ptr = &sStack_538;
  if (argc == 3) {
    font2svg::glyph::glyph(&g,argv[1],argv[2]);
    font2svg::glyph::svgheader_abi_cxx11_(&local_418,&g);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_418);
    font2svg::glyph::svgborder_abi_cxx11_(&local_438,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_438);
    font2svg::glyph::svgtransform_abi_cxx11_(&local_458,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_458);
    font2svg::glyph::axes_abi_cxx11_(&local_478,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_478);
    font2svg::glyph::typography_box_abi_cxx11_(&local_498,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_498);
    font2svg::glyph::points_abi_cxx11_(&local_4b8,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_4b8);
    font2svg::glyph::pointlines_abi_cxx11_(&local_4d8,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_4d8);
    font2svg::glyph::outline_abi_cxx11_(&local_4f8,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_4f8);
    font2svg::glyph::labelpts_abi_cxx11_(&local_518,&g);
    poVar1 = std::operator<<(poVar1,(string *)&local_518);
    font2svg::glyph::svgfooter_abi_cxx11_(&sStack_538,&g);
    std::operator<<(poVar1,(string *)&sStack_538);
    std::__cxx11::string::~string((string *)&sStack_538);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    font2svg::ttf_file::free(&g.file,__ptr);
    font2svg::glyph::~glyph(&g);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  std::operator<<(poVar1," file.ttf 0x0042\n");
  exit(1);
}

Assistant:

int main( int argc, char * argv[] )
{
	if (argc!=3) {
		std::cerr << "usage: " << argv[0] << " file.ttf 0x0042\n";
		exit( 1 );
	}

	font2svg::glyph g( argv[1], argv[2] );
	std::cout << g.svgheader()
		<< g.svgborder()
		<< g.svgtransform()
		<< g.axes()
		<< g.typography_box()
		<< g.points()
		<< g.pointlines()
		<< g.outline()
		<< g.labelpts()
		<< g.svgfooter();

	g.free();

  return 0;
}